

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O0

Variant * Jinx::Impl::GetCallStack
                    (Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  pointer *this;
  bool bVar1;
  element_type *this_00;
  map<Jinx::Variant,Jinx::Variant,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
  *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
  *local_c0;
  pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
  local_b8;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *local_90;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *fnName;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
  *__range2;
  int64_t index;
  CollectionPtr var;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
  functions;
  ScriptIPtr s;
  Parameters *params_local;
  ScriptPtr *script_local;
  
  this = &functions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::static_pointer_cast<Jinx::Impl::Script,Jinx::IScript>((shared_ptr<Jinx::IScript> *)this);
  this_00 = std::__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  Script::GetCallStack_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
              *)local_48,this_00);
  CreateCollection();
  __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
              *)0x1;
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
                    *)local_48);
  fnName = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
                  *)local_48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>
                                *)&fnName);
    if (!bVar1) break;
    local_90 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>
               ::operator*(&__end2);
    this_01 = (map<Jinx::Variant,Jinx::Variant,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
               *)std::
                 __shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&index);
    local_c0 = __range2;
    std::
    make_pair<long,std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const&>
              (&local_b8,(long *)&local_c0,local_90);
    std::
    map<Jinx::Variant,Jinx::Variant,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
    ::
    insert<std::pair<long,std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>>
              (this_01,&local_b8);
    std::
    pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>::
    ~pair(&local_b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>
    ::operator++(&__end2);
    __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
                *)((long)&(__range2->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  Variant::Variant(__return_storage_ptr__,(CollectionPtr *)&index);
  std::
  shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
  ::~shared_ptr((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                 *)&index);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
             *)local_48);
  std::shared_ptr<Jinx::Impl::Script>::~shared_ptr
            ((shared_ptr<Jinx::Impl::Script> *)
             &functions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant GetCallStack(ScriptPtr script, [[maybe_unused]] const Parameters & params)
	{
		ScriptIPtr s = std::static_pointer_cast<Script>(script);
		auto functions = s->GetCallStack();
		auto var = CreateCollection();
		int64_t index = 1;
		for (const auto & fnName : functions)
			var->insert(std::make_pair(index++, fnName));
		return var;
	}